

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void y8950_write_pcmrom(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  FM_OPL *Y8950;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *chip_local;
  
  if (offset <= *(uint *)(*(long *)((long)chip + 0x1738) + 0x28)) {
    data_local._0_4_ = length;
    if (*(uint *)(*(long *)((long)chip + 0x1738) + 0x28) < offset + length) {
      data_local._0_4_ = *(int *)(*(long *)((long)chip + 0x1738) + 0x28) - offset;
    }
    memcpy((void *)(*(long *)(*(long *)((long)chip + 0x1738) + 8) + (ulong)offset),data,
           (ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

void y8950_write_pcmrom(void* chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	FM_OPL *Y8950 = (FM_OPL *)chip;
	
	if (offset > Y8950->deltat->memory_size)
		return;
	if (offset + length > Y8950->deltat->memory_size)
		length = Y8950->deltat->memory_size - offset;
	
	memcpy(Y8950->deltat->memory + offset, data, length);
	
	return;
}